

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::~SimpSolver(SimpSolver *this)

{
  Solver *in_RDI;
  
  ((vec<Minisat::vec<unsigned_int>_> *)&in_RDI->_vptr_Solver)->data =
       (vec<unsigned_int> *)&PTR__SimpSolver_00179c78;
  vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x15a47d);
  vec<char>::~vec((vec<char> *)0x15a48e);
  vec<char>::~vec((vec<char> *)0x15a49f);
  Queue<unsigned_int>::~Queue((Queue<unsigned_int> *)0x15a4b0);
  Heap<Minisat::SimpSolver::ElimLt>::~Heap((Heap<Minisat::SimpSolver::ElimLt> *)in_RDI);
  vec<int>::~vec((vec<int> *)0x15a4d2);
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::~OccLists
            ((OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)in_RDI
            );
  vec<char>::~vec((vec<char> *)0x15a4f4);
  vec<unsigned_int>::~vec((vec<unsigned_int> *)0x15a505);
  Solver::~Solver(in_RDI);
  return;
}

Assistant:

SimpSolver::~SimpSolver() {}